

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O1

uint32_t corrupt_action(warm_cb *data,uint32_t action,int ec_type)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  float fVar4;
  float fVar5;
  
  if (ec_type == 1) {
    fVar4 = data->cor_prob_ws;
  }
  else {
    fVar4 = 0.0;
  }
  iVar1 = data->cor_type_ws;
  fVar5 = merand48(&data->all->random_state);
  if (fVar5 < fVar4) {
    iVar2 = 1;
    if (ec_type == 1) {
      iVar2 = iVar1;
    }
    if (iVar2 == 3) {
      action = data->overwrite_label;
    }
    else {
      if (iVar2 == 1) {
        uVar3 = generate_uar_action(data);
        return uVar3;
      }
      action = action % data->num_actions + 1;
    }
  }
  return action;
}

Assistant:

uint32_t corrupt_action(warm_cb& data, uint32_t action, int ec_type)
{
	float cor_prob=0.;
	uint32_t cor_type=UAR;
	uint32_t cor_action;

	if (ec_type == WARM_START)
	{
		cor_prob = data.cor_prob_ws;
		cor_type = data.cor_type_ws;
	}

	float randf = merand48(data.all->random_state);
	if (randf < cor_prob)
	{
		if (cor_type == UAR)
			cor_action = generate_uar_action(data);
		else if (cor_type == OVERWRITE)
			cor_action = data.overwrite_label;
		else
			cor_action = (action % data.num_actions) + 1;
	}
	else
		cor_action = action;
	return cor_action;
}